

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

void __thiscall pktalloc::Allocator::Free(Allocator *this,uint8_t *ptr)

{
  int iVar1;
  WindowHeader *pWVar2;
  bool bVar3;
  uint uVar4;
  uint bitEnd;
  long in_RSI;
  Allocator *in_RDI;
  WindowHeader *replacement;
  uint fullIndex;
  uint fullCount;
  uint regionEnd;
  uint regionStart;
  uint units;
  WindowHeader *window;
  AllocationHeader *regionHeader;
  uint newSize;
  uint8_t *in_stack_ffffffffffffff58;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *pLVar5;
  uint elements;
  CustomBitSet<2048U> *local_78;
  undefined8 *local_70;
  uint local_54;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_50;
  int local_44;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_40;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_38;
  int local_2c;
  CustomBitSet<2048U> **local_28;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_20;
  undefined8 *local_10;
  undefined8 *local_8;
  
  if ((in_RSI != 0) && (local_70 = (undefined8 *)(in_RSI + -0x20), *(int *)(in_RSI + -0x18) != 0)) {
    local_78 = (CustomBitSet<2048U> *)*local_70;
    local_10 = local_70;
    if (local_78 == (CustomBitSet<2048U> *)0x0) {
      *(undefined4 *)(in_RSI + -0x18) = 0;
      fallbackFree(in_RDI,in_stack_ffffffffffffff58);
    }
    else {
      iVar1 = *(int *)(in_RSI + -0x18);
      *(undefined4 *)(in_RSI + -0x18) = 0;
      uVar4 = (uint)((int)local_70 - ((int)*local_70 + 0x120)) >> 5;
      bitEnd = uVar4 + iVar1;
      if (uVar4 < *(uint *)(local_78 + 0x104)) {
        *(uint *)(local_78 + 0x104) = uVar4;
      }
      local_8 = local_70;
      CustomBitSet<2048U>::ClearRange(local_78,uVar4,bitEnd);
      *(int *)(local_78 + 0x100) = iVar1 + *(int *)(local_78 + 0x100);
      if ((0x5ff < *(uint *)(local_78 + 0x100)) && (*(int *)(local_78 + 0x108) != -1)) {
        *(undefined4 *)(local_78 + 0x104) = 0;
        local_38 = &in_RDI->FullWindows;
        uVar4 = (in_RDI->FullWindows).Size;
        elements = *(uint *)(local_78 + 0x108);
        if (elements < uVar4 - 1) {
          local_40 = &in_RDI->FullWindows;
          local_44 = uVar4 - 1;
          pWVar2 = (in_RDI->FullWindows).DataPtr[local_44];
          local_50 = &in_RDI->FullWindows;
          (in_RDI->FullWindows).DataPtr[(int)elements] = pWVar2;
          pWVar2->FullListIndex = elements;
          local_54 = elements;
        }
        LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_Copy
                  ((LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)CONCAT44(bitEnd,uVar4),
                   elements);
        *(undefined4 *)(local_78 + 0x108) = 0xffffffff;
        pLVar5 = &in_RDI->PreferredWindows;
        local_28 = &local_78;
        local_2c = (in_RDI->PreferredWindows).Size + 1;
        local_20 = pLVar5;
        bVar3 = LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_Copy
                          ((LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)
                           CONCAT44(bitEnd,uVar4),elements);
        if (bVar3) {
          pLVar5->DataPtr[local_2c - 1] = (WindowHeader *)*local_28;
        }
      }
    }
  }
  return;
}

Assistant:

void Allocator::Free(uint8_t* ptr)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    if (!ptr) {
        return;
    }
    PKTALLOC_DEBUG_ASSERT((uintptr_t)ptr % kUnitSize == 0);

    AllocationHeader* regionHeader = (AllocationHeader*)(ptr - kUnitSize);
#ifdef PKTALLOC_DEBUG
    if (regionHeader->Canary != AllocationHeader::kCanaryExpected) {
        PKTALLOC_DEBUG_BREAK(); // Buffer overflow detected
        return;
    }
#endif // PKTALLOC_DEBUG
    if (regionHeader->IsFreed()) {
        PKTALLOC_DEBUG_BREAK(); // Double-free
        return;
    }

    WindowHeader* window = regionHeader->Header;
    if (!window)
    {
        regionHeader->UsedUnits = 0; // Mark freed
        fallbackFree(ptr);
        return;
    }

    const unsigned units = regionHeader->UsedUnits;
    PKTALLOC_DEBUG_ASSERT(units >= 2 && units <= kFallbackThresholdUnits);
    regionHeader->UsedUnits = 0; // Mark freed

    PKTALLOC_DEBUG_ASSERT((uint8_t*)regionHeader >= (uint8_t*)regionHeader->Header + kWindowHeaderBytes);
    unsigned regionStart = regionHeader->GetUnitStart();
    PKTALLOC_DEBUG_ASSERT(regionStart < kWindowMaxUnits);
    PKTALLOC_DEBUG_ASSERT(regionStart + units <= kWindowMaxUnits);

    unsigned regionEnd = regionStart + units;

    // Resume scanning from this hole next time
    if (window->ResumeScanOffset > regionStart) {
        window->ResumeScanOffset = regionStart;
    }

    // Clear the units it was using
    window->Used.ClearRange(regionStart, regionEnd);

    // Give back the unit count
    window->FreeUnitCount += units;

    // If we may want to promote this to Preferred:
    if (window->FreeUnitCount >= kPreferredThresholdUnits &&
        window->FullListIndex != kNotInFullList)
    {
        // Restart scanning from the front
        window->ResumeScanOffset = 0;

        // Swap last item in full list into the slot
        const unsigned fullCount = FullWindows.GetSize();
        const unsigned fullIndex = (unsigned)window->FullListIndex;
        PKTALLOC_DEBUG_ASSERT(fullIndex < fullCount);
        PKTALLOC_DEBUG_ASSERT(fullCount > 0);
        if (fullIndex < fullCount - 1)
        {
            WindowHeader* replacement = FullWindows.GetRef(fullCount - 1);
            FullWindows.GetRef(fullIndex) = replacement;
            replacement->FullListIndex = fullIndex;
        }
        FullWindows.SetSize_Copy(fullCount - 1);

        window->FullListIndex = kNotInFullList;
        PreferredWindows.Append(window);
    }

#ifdef PKTALLOC_SHRINK
    // If we should do some bulk cleanup:
    if (window->FreeUnitCount >= kWindowMaxUnits &&
        !window->Preallocated &&
        ++EmptyWindowCount >= kEmptyWindowCleanupThreshold)
    {
        freeEmptyWindows();
    }
#endif // PKTALLOC_SHRINK

    ALLOC_DEBUG_INTEGRITY_CHECK();
}